

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxJumpStatement::Emit(FxJumpStatement *this,VMFunctionBuilder *build)

{
  char *pcVar1;
  size_t sVar2;
  ExpEmit local_38;
  undefined1 local_28 [16];
  VMFunctionBuilder *build_local;
  FxJumpStatement *this_local;
  
  local_28._8_8_ = build;
  build_local = (VMFunctionBuilder *)this;
  if (this->AddressResolver == (FxExpression *)0x0) {
    FScanner::TokenName((FScanner *)local_28,*(int *)&(this->super_FxExpression).field_0x34,
                        (char *)0x0);
    pcVar1 = FString::GetChars((FString *)local_28);
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Jump statement %s has nowhere to go!",
               pcVar1);
    FString::~FString((FString *)local_28);
  }
  sVar2 = VMFunctionBuilder::Emit((VMFunctionBuilder *)local_28._8_8_,0x37,0);
  this->Address = sVar2;
  ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5));
  local_38._2_1_ = this_local._7_1_;
  local_38.RegNum = this_local._5_1_;
  local_38.RegType = this_local._6_1_;
  return local_38;
}

Assistant:

ExpEmit FxJumpStatement::Emit(VMFunctionBuilder *build)
{
	if (AddressResolver == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Jump statement %s has nowhere to go!", FScanner::TokenName(Token).GetChars());
	}

	Address = build->Emit(OP_JMP, 0);

	return ExpEmit();
}